

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> * __thiscall
Catch::splitStringRef
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          Catch *this,StringRef str,char delimiter)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char *index;
  char *pcVar4;
  StringRef local_50;
  StringRef local_40;
  
  local_50.m_size = (size_type)str.m_start;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar4 = (char *)0x0;
  local_50.m_start = (char *)this;
  for (index = (char *)0x0; index < local_50.m_size; index = index + 1) {
    cVar1 = StringRef::operator[](&local_50,(size_type)index);
    if (cVar1 == (char)str.m_size) {
      uVar2 = (long)index - (long)pcVar4;
      if (1 < uVar2) {
        uVar3 = local_50.m_size - (long)pcVar4;
        if (local_50.m_size < pcVar4 || uVar3 == 0) {
          local_40.m_start = "";
          local_40.m_size = 0;
        }
        else {
          local_40.m_start = pcVar4 + (long)local_50.m_start;
          local_40.m_size = uVar2;
          if (uVar3 < uVar2) {
            local_40.m_size = uVar3;
          }
        }
        std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
        emplace_back<Catch::StringRef>(__return_storage_ptr__,&local_40);
      }
      pcVar4 = index + 1;
    }
  }
  local_40.m_size = local_50.m_size - (long)pcVar4;
  if (pcVar4 <= local_50.m_size && local_40.m_size != 0) {
    local_40.m_start = pcVar4 + (long)local_50.m_start;
    std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::emplace_back<Catch::StringRef>
              (__return_storage_ptr__,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> splitStringRef( StringRef str, char delimiter ) {
        std::vector<StringRef> subStrings;
        std::size_t start = 0;
        for(std::size_t pos = 0; pos < str.size(); ++pos ) {
            if( str[pos] == delimiter ) {
                if( pos - start > 1 )
                    subStrings.push_back( str.substr( start, pos-start ) );
                start = pos+1;
            }
        }
        if( start < str.size() )
            subStrings.push_back( str.substr( start, str.size()-start ) );
        return subStrings;
    }